

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O3

bool TestDistribution<unsigned_int>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *hashes,bool drawDiagram)

{
  bool bVar1;
  undefined8 uVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint count;
  uint uVar8;
  uint bincount;
  long lVar9;
  ulong uVar10;
  undefined7 in_register_00000031;
  pointer puVar11;
  ulong uVar12;
  int start;
  uint start_00;
  ulong uVar13;
  ushort uVar14;
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  double dVar22;
  undefined1 auVar23 [16];
  vector<int,_std::allocator<int>_> bins;
  double local_68;
  vector<int,_std::allocator<int>_> local_58;
  size_t local_40;
  double local_38;
  
  auVar21 = in_ZMM0._0_16_;
  printf("Testing distribution - ");
  if ((int)CONCAT71(in_register_00000031,drawDiagram) != 0) {
    putchar(10);
  }
  count = 0x15;
  auVar21 = vcvtusi2sd_avx512f(auVar21,(long)(hashes->
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(hashes->
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             )._M_impl.super__Vector_impl_data._M_start >> 2);
  do {
    count = count - 1;
    uVar8 = 1 << (count & 0x1f);
  } while (auVar21._0_8_ / (double)(int)uVar8 < 5.0);
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&local_58,(long)(int)uVar8);
  local_40 = (long)(int)uVar8 << 2;
  uVar12 = 0xffffffff;
  uVar13 = 0xffffffff;
  start_00 = 0;
  local_68 = 0.0;
  do {
    memset(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start,0,local_40);
    puVar11 = (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar11) {
      lVar9 = 0;
      uVar10 = 0;
      do {
        uVar6 = window32((void *)((long)puVar11 + lVar9),4,start_00,count);
        uVar10 = uVar10 + 1;
        lVar9 = lVar9 + 4;
        local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar6] =
             local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar6] + 1;
        puVar11 = (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar10 < (ulong)((long)(hashes->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)puVar11 >>
                               2));
    }
    if (drawDiagram) {
      putchar(0x5b);
    }
    bincount = uVar8;
    uVar5 = count;
    if (0xff < (int)uVar8) {
      do {
        auVar15._0_8_ =
             calcScore(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,bincount,
                       (int)((ulong)((long)(hashes->
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(hashes->
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          )._M_impl.super__Vector_impl_data._M_start) >> 2));
        auVar15._8_56_ = extraout_var;
        auVar21 = auVar15._0_16_;
        if (drawDiagram) {
          local_38 = auVar15._0_8_;
          plot(auVar15._0_8_);
          auVar21._8_8_ = 0;
          auVar21._0_8_ = local_38;
        }
        auVar23._8_8_ = 0;
        auVar23._0_8_ = local_68;
        auVar23 = vmaxsd_avx(auVar21,auVar23);
        dVar22 = auVar23._0_8_;
        if (local_68 < auVar21._0_8_) {
          uVar13 = (ulong)start_00;
          uVar12 = (ulong)uVar5;
        }
        local_68 = dVar22;
        if ((int)uVar5 < 9) break;
        auVar15 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        if (bincount < 2) break;
        uVar7 = bincount >> 1;
        auVar17 = vpbroadcastq_avx512f();
        uVar10 = 0;
        do {
          auVar18 = vpbroadcastq_avx512f();
          auVar19 = vporq_avx512f(auVar18,auVar15);
          auVar18 = vporq_avx512f(auVar18,auVar16);
          uVar2 = vpcmpuq_avx512f(auVar18,auVar17,2);
          bVar3 = (byte)uVar2;
          uVar2 = vpcmpuq_avx512f(auVar19,auVar17,2);
          bVar4 = (byte)uVar2;
          uVar14 = CONCAT11(bVar4,bVar3);
          auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       (local_58.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start + uVar7 + uVar10));
          auVar19._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar18._4_4_;
          auVar19._0_4_ = (uint)(bVar3 & 1) * auVar18._0_4_;
          auVar19._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar18._8_4_;
          auVar19._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar18._12_4_;
          auVar19._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar18._16_4_;
          auVar19._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar18._20_4_;
          auVar19._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar18._24_4_;
          auVar19._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar18._28_4_;
          auVar19._32_4_ = (uint)(bVar4 & 1) * auVar18._32_4_;
          auVar19._36_4_ = (uint)(bVar4 >> 1 & 1) * auVar18._36_4_;
          auVar19._40_4_ = (uint)(bVar4 >> 2 & 1) * auVar18._40_4_;
          auVar19._44_4_ = (uint)(bVar4 >> 3 & 1) * auVar18._44_4_;
          auVar19._48_4_ = (uint)(bVar4 >> 4 & 1) * auVar18._48_4_;
          auVar19._52_4_ = (uint)(bVar4 >> 5 & 1) * auVar18._52_4_;
          auVar19._56_4_ = (uint)(bVar4 >> 6 & 1) * auVar18._56_4_;
          auVar19._60_4_ = (uint)(bVar4 >> 7) * auVar18._60_4_;
          auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       (local_58.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start + uVar10));
          auVar20._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar18._4_4_;
          auVar20._0_4_ = (uint)(bVar3 & 1) * auVar18._0_4_;
          auVar20._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar18._8_4_;
          auVar20._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar18._12_4_;
          auVar20._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar18._16_4_;
          auVar20._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar18._20_4_;
          auVar20._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar18._24_4_;
          auVar20._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar18._28_4_;
          auVar20._32_4_ = (uint)(bVar4 & 1) * auVar18._32_4_;
          auVar20._36_4_ = (uint)(bVar4 >> 1 & 1) * auVar18._36_4_;
          auVar20._40_4_ = (uint)(bVar4 >> 2 & 1) * auVar18._40_4_;
          auVar20._44_4_ = (uint)(bVar4 >> 3 & 1) * auVar18._44_4_;
          auVar20._48_4_ = (uint)(bVar4 >> 4 & 1) * auVar18._48_4_;
          auVar20._52_4_ = (uint)(bVar4 >> 5 & 1) * auVar18._52_4_;
          auVar20._56_4_ = (uint)(bVar4 >> 6 & 1) * auVar18._56_4_;
          auVar20._60_4_ = (uint)(bVar4 >> 7) * auVar18._60_4_;
          auVar18 = vpaddd_avx512f(auVar20,auVar19);
          auVar18 = vmovdqu32_avx512f(auVar18);
          *(undefined1 (*) [64])
           (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start + uVar10) = auVar18;
          uVar10 = uVar10 + 0x10;
        } while ((uVar7 + 0xf & 0x7ffffff0) != uVar10);
        bVar1 = 0x1ff < bincount;
        bincount = uVar7;
        uVar5 = uVar5 - 1;
      } while (bVar1);
    }
    if (drawDiagram) {
      puts("]");
    }
    start_00 = start_00 + 1;
    if (start_00 == 0x20) {
      printf("Worst bias is the %2d-bit window at bit %2d - %.3f%%",uVar12,uVar13);
      if (1.0 <= local_68 * 100.0) {
        puts(" !!!!!");
      }
      else {
        putchar(10);
      }
      if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return local_68 * 100.0 < 1.0;
    }
  } while( true );
}

Assistant:

bool TestDistribution ( std::vector<hashtype> & hashes, bool drawDiagram )
{
  printf("Testing distribution - ");

  if(drawDiagram) printf("\n");

  const int hashbits = sizeof(hashtype) * 8;

  int maxwidth = 20;

  // We need at least 5 keys per bin to reliably test distribution biases
  // down to 1%, so don't bother to test sparser distributions than that

  while(double(hashes.size()) / double(1 << maxwidth) < 5.0)
  {
    maxwidth--;
  }

  std::vector<int> bins;
  bins.resize(1 << maxwidth);

  double worst = 0;
  int worstStart = -1;
  int worstWidth = -1;

  for(int start = 0; start < hashbits; start++)
  {
    int width = maxwidth;
    int bincount = (1 << width);

    memset(&bins[0],0,sizeof(int)*bincount);

    for(size_t j = 0; j < hashes.size(); j++)
    {
      hashtype & hash = hashes[j];

      uint32_t index = window(&hash,sizeof(hash),start,width);

      bins[index]++;
    }

    // Test the distribution, then fold the bins in half,
    // repeat until we're down to 256 bins

    if(drawDiagram) printf("[");

    while(bincount >= 256)
    {
      double n = calcScore(&bins[0],bincount,(int)hashes.size());

      if(drawDiagram) plot(n);

      if(n > worst)
      {
        worst = n;
        worstStart = start;
        worstWidth = width;
      }

      width--;
      bincount /= 2;

      if(width < 8) break;

      for(int i = 0; i < bincount; i++)
      {
        bins[i] += bins[i+bincount];
      }
    }

    if(drawDiagram) printf("]\n");
  }

  double pct = worst * 100.0;

  printf("Worst bias is the %2d-bit window at bit %2d - %.3f%%",
         worstWidth, worstStart, pct);
  if(pct >= 1.0) {
    printf(" !!!!!\n");
    return false;
  }
  else {
    printf("\n");
    return true;
  }
}